

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O2

void av1_loop_restoration_filter_frame
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int optimized_lr,void *lr_ctxt)

{
  int iVar1;
  int iVar2;
  aom_internal_error_info *paVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  RestorationInfo *pRVar13;
  ulong uVar14;
  ulong uVar15;
  int ext_size;
  int iVar16;
  bool bVar17;
  int plane_h;
  int plane_w;
  RestorationInfo *local_90;
  int local_88;
  int local_84;
  int local_80;
  uint local_7c;
  long local_78;
  ulong local_70;
  undefined8 *local_68;
  ulong local_60;
  AV1_COMMON *local_58;
  RestorationLineBuffers *local_50;
  int32_t *local_48;
  long local_40;
  code *local_38;
  
  uVar6 = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  uVar15 = (ulong)uVar6;
  av1_loop_restoration_filter_frame_init((AV1LrStruct *)lr_ctxt,frame,cm,optimized_lr,uVar6);
  local_78 = (long)lr_ctxt + 8;
  pRVar13 = cm->rst_info;
  local_90 = pRVar13;
  local_70 = uVar15;
  local_68 = (undefined8 *)lr_ctxt;
  local_58 = cm;
  for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
    if (pRVar13[uVar14].frame_restoration_type != RESTORE_NONE) {
      iVar10 = 0;
      bVar17 = false;
      if (uVar14 != 0) {
        bVar17 = cm->seq_params->subsampling_y != 0;
      }
      local_38 = *lr_ctxt;
      local_40 = uVar14 * 0x38 + local_78;
      local_48 = cm->rst_tmpbuf;
      local_50 = cm->rlbs;
      iVar1 = pRVar13[uVar14].restoration_unit_size;
      iVar2 = pRVar13[uVar14].horz_units;
      iVar16 = (iVar1 * 3) / 2;
      local_60 = uVar14;
      av1_get_upsampled_plane_size(cm,(uint)(uVar14 != 0),&plane_w,&plane_h);
      iVar5 = plane_w;
      iVar4 = plane_h;
      uVar6 = 0 >> bVar17;
      while (iVar11 = iVar4 - uVar6, pRVar13 = local_90, uVar14 = local_60, lr_ctxt = local_68,
            uVar15 = local_70, iVar11 != 0 && (int)uVar6 <= iVar4) {
        if (iVar16 <= iVar11) {
          iVar11 = iVar1;
        }
        uVar12 = iVar11 + uVar6;
        local_80 = uVar6 - (8U >> bVar17);
        if (local_80 < 1) {
          local_80 = 0;
        }
        local_7c = uVar12;
        if ((int)uVar12 < iVar4) {
          local_7c = uVar12 - (8U >> bVar17);
        }
        paVar3 = cm->error;
        iVar11 = 0;
        iVar9 = iVar10;
        while (iVar7 = iVar5 - iVar11, iVar7 != 0 && iVar11 <= iVar5) {
          if (iVar16 <= iVar7) {
            iVar7 = iVar1;
          }
          local_88 = iVar11;
          local_84 = iVar11 + iVar7;
          (*local_38)(&local_88,iVar9,local_40,local_48,local_50,paVar3);
          iVar9 = iVar9 + 1;
          iVar11 = iVar11 + iVar7;
        }
        iVar10 = iVar10 + iVar2;
        cm = local_58;
        uVar6 = uVar12;
      }
    }
  }
  puVar8 = (undefined4 *)((long)lr_ctxt + 0x1c);
  for (uVar14 = 0; (uint)((int)uVar15 << 3) != uVar14; uVar14 = uVar14 + 8) {
    if ((&pRVar13->frame_restoration_type)[uVar14 * 2] != RESTORE_NONE) {
      (**(code **)((long)&loop_restoration_copy_planes_copy_funs + uVar14))
                (*(undefined8 *)((long)lr_ctxt + 0xb8),*(undefined8 *)((long)lr_ctxt + 0xb0),0,
                 puVar8[-1],0,*puVar8);
      pRVar13 = local_90;
    }
    puVar8 = puVar8 + 0xe;
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_frame(YV12_BUFFER_CONFIG *frame,
                                       AV1_COMMON *cm, int optimized_lr,
                                       void *lr_ctxt) {
  assert(!cm->features.all_lossless);
  const int num_planes = av1_num_planes(cm);

  AV1LrStruct *loop_rest_ctxt = (AV1LrStruct *)lr_ctxt;

  av1_loop_restoration_filter_frame_init(loop_rest_ctxt, frame, cm,
                                         optimized_lr, num_planes);

  foreach_rest_unit_in_planes(loop_rest_ctxt, cm, num_planes);

  loop_restoration_copy_planes(loop_rest_ctxt, cm, num_planes);
}